

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_remove_checked(void)

{
  roaring_bitmap_t *r;
  unsigned_long unaff_retaddr;
  uint32_t i_1;
  uint32_t i;
  roaring_bitmap_t *bm;
  uint32_t in_stack_0000002c;
  roaring_bitmap_t *in_stack_00000030;
  int in_stack_ffffffffffffffec;
  uint uVar1;
  uint uVar2;
  
  r = roaring_bitmap_create();
  for (uVar2 = 0; uVar2 < 0x7d; uVar2 = uVar2 + 1) {
    roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  }
  for (uVar1 = 0; uVar1 < 0x7d; uVar1 = uVar1 + 1) {
    roaring_bitmap_remove_checked(bm,i);
    _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
    roaring_bitmap_remove_checked(bm,i);
    _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
  }
  roaring_bitmap_remove_checked(bm,i);
  _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
  roaring_bitmap_add(in_stack_00000030,in_stack_0000002c);
  roaring_bitmap_remove_checked(bm,i);
  _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
  roaring_bitmap_is_empty(r);
  _assert_true(unaff_retaddr,(char *)r,(char *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec);
  roaring_bitmap_free((roaring_bitmap_t *)0x11096e);
  return;
}

Assistant:

DEFINE_TEST(test_remove_checked) {
    roaring_bitmap_t *bm = roaring_bitmap_create();
    for (uint32_t i = 0; i < 125; ++i) {
        roaring_bitmap_add(bm, i * 3533);
    }
    for (uint32_t i = 0; i < 125; ++i) {
        assert_true(roaring_bitmap_remove_checked(bm, i * 3533));
        assert_false(roaring_bitmap_remove_checked(bm, i * 3533));
    }
    assert_false(roaring_bitmap_remove_checked(bm, 999));
    roaring_bitmap_add(bm, 999);
    assert_true(roaring_bitmap_remove_checked(bm, 999));
    assert_true(roaring_bitmap_is_empty(bm));
    roaring_bitmap_free(bm);
}